

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O3

void __thiscall
test::prod_test::iu_PeepTest_x_iutest_x_StaticPeep_Test::Body
          (iu_PeepTest_x_iutest_x_StaticPeep_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  *iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>::value = 4
  ;
  local_198._0_4_ = 4;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = ProdClass::m_y;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f0,(internal *)0x32d88d,"ProdClass::GetY()",local_198,(int *)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xd2;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  paVar1 = &local_1f0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f0,(internal *)0x32d88d,
             "(*::iutest::detail::peep_tag< iu_peep_tag_m_y<ProdClass> >::value)",local_198,
             iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_y<test::prod_test::ProdClass>>
             ::value,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xd4;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(PeepTest, StaticPeep)
{
    IUTEST_PEEP_STATIC_GET(ProdClass, m_y) = 4;
    IUTEST_EXPECT_EQ(4, ProdClass::GetY());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_STATIC_GET(ProdClass, m_y));
}